

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenPackedType
BinaryenStructTypeGetFieldPackedType(BinaryenHeapType heapType,BinaryenIndex index)

{
  bool bVar1;
  Struct *this;
  ulong uVar2;
  size_type sVar3;
  const_reference pvVar4;
  FieldList *fields;
  HeapType ht;
  BinaryenIndex index_local;
  BinaryenHeapType heapType_local;
  
  ht.id._4_4_ = index;
  wasm::HeapType::HeapType((HeapType *)&fields,heapType);
  bVar1 = wasm::HeapType::isStruct((HeapType *)&fields);
  if (!bVar1) {
    __assert_fail("ht.isStruct()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                  ,0x152,
                  "BinaryenPackedType BinaryenStructTypeGetFieldPackedType(BinaryenHeapType, BinaryenIndex)"
                 );
  }
  this = wasm::HeapType::getStruct((HeapType *)&fields);
  uVar2 = (ulong)ht.id._4_4_;
  sVar3 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::size(&this->fields);
  if (uVar2 < sVar3) {
    pvVar4 = std::vector<wasm::Field,_std::allocator<wasm::Field>_>::operator[]
                       (&this->fields,(ulong)ht.id._4_4_);
    return pvVar4->packedType;
  }
  __assert_fail("index < fields.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/binaryen-c.cpp"
                ,0x154,
                "BinaryenPackedType BinaryenStructTypeGetFieldPackedType(BinaryenHeapType, BinaryenIndex)"
               );
}

Assistant:

BinaryenPackedType
BinaryenStructTypeGetFieldPackedType(BinaryenHeapType heapType,
                                     BinaryenIndex index) {
  auto ht = HeapType(heapType);
  assert(ht.isStruct());
  auto& fields = ht.getStruct().fields;
  assert(index < fields.size());
  return fields[index].packedType;
}